

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::standard_reporter::do_configure(standard_reporter *this,configuration *cfg)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 *in_RSI;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x28) = *in_RSI;
  *(byte *)(in_RDI + 0x30) = *(byte *)(in_RSI + 0x27) & 1;
  *(byte *)(in_RDI + 0x31) = *(byte *)((long)in_RSI + 0x9d) & 1;
  *(undefined4 *)(in_RDI + 0x2c) = in_RSI[4];
  if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
    bVar1 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                     *)0x1eb8e5);
    if (!bVar1) {
      poVar2 = reporter::report_stream((reporter *)0x1eb8f2);
      std::operator<<(poVar2,"parameters\n");
      nonius::operator<<((ostream *)this,(parameters *)cfg);
    }
  }
  return;
}

Assistant:

void do_configure(configuration& cfg) override {
            n_samples = cfg.samples;
            verbose = cfg.verbose;
            summary = cfg.summary;
            n_resamples = cfg.resamples;
            if(!summary && !cfg.params.map.empty()) report_stream() << "parameters\n" << cfg.params.map;
        }